

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O1

Am_Wrapper * pass_window_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *this;
  Am_Wrapper *pAVar4;
  Am_Object owner;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&AStack_28);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,&Am_Graphical_Object);
    bVar2 = Am_Object::Is_Instance_Of(&AStack_28,&local_18);
    if (bVar2) {
      bVar3 = true;
      bVar2 = false;
    }
    else {
      Am_Object::Am_Object(&local_20,&Am_Window);
      bVar3 = Am_Object::Is_Instance_Of(&AStack_28,&local_20);
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
    bVar3 = false;
  }
  if (bVar2) {
    Am_Object::~Am_Object(&local_20);
  }
  if (bVar1) {
    Am_Object::~Am_Object(&local_18);
  }
  if (bVar3 == false) {
    pAVar4 = (Am_Wrapper *)0x0;
  }
  else {
    this = Am_Object::Get(&AStack_28,0x68,0);
    pAVar4 = Am_Value::operator_cast_to_Am_Wrapper_(this);
  }
  Am_Object::~Am_Object(&AStack_28);
  return pAVar4;
}

Assistant:

Am_Define_Object_Formula(pass_window)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && (owner.Is_Instance_Of(Am_Graphical_Object) ||
                        owner.Is_Instance_Of(Am_Window)))
    return owner.Get(Am_WINDOW);
  else
    return nullptr;
}